

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckingVisitor.cpp
# Opt level: O0

void __thiscall TypeCheckingVisitor::Visit(TypeCheckingVisitor *this,FieldAccess *field_access)

{
  __tuple_element_t<2UL,_tuple<unordered_map<Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>_>_>_>,_unordered_map<Symbol,_shared_ptr<Method>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_shared_ptr<Method>_>_>_>,_unordered_map<Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>_>_>_>_>_>
  *p_Var1;
  __tuple_element_t<2UL,_tuple<unordered_map<Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>_>_>_>,_unordered_map<Symbol,_shared_ptr<Method>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_shared_ptr<Method>_>_>_>,_unordered_map<Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>_>_>_>_>_>
  *this_00;
  bool bVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  string local_108;
  Symbol local_e8;
  string local_c8;
  Symbol local_a8;
  _Node_iterator_base<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_true>
  local_88 [3];
  string local_70;
  Symbol local_50;
  _Node_iterator_base<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_true>
  local_30;
  __tuple_element_t<2UL,_tuple<unordered_map<Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>_>_>_>,_unordered_map<Symbol,_shared_ptr<Method>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_shared_ptr<Method>_>_>_>,_unordered_map<Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>_>_>_>_>_>
  *local_28;
  __tuple_element_t<2UL,_tuple<unordered_map<Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>_>_>_>,_unordered_map<Symbol,_shared_ptr<Method>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_shared_ptr<Method>_>_>_>,_unordered_map<Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>_>_>_>_>_>
  *arr_fields;
  __tuple_element_t<0UL,_tuple<unordered_map<Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>_>_>_>,_unordered_map<Symbol,_shared_ptr<Method>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_shared_ptr<Method>_>_>_>,_unordered_map<Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>_>_>_>_>_>
  *fields;
  FieldAccess *field_access_local;
  TypeCheckingVisitor *this_local;
  
  fields = (__tuple_element_t<0UL,_tuple<unordered_map<Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>_>_>_>,_unordered_map<Symbol,_shared_ptr<Method>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_shared_ptr<Method>_>_>_>,_unordered_map<Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>_>_>_>_>_>
            *)field_access;
  field_access_local = (FieldAccess *)this;
  pmVar3 = std::
           unordered_map<Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>_>_>_>
           ::operator[](&this->tree_->class_symbols_table_,&this->current_layer_->class_symbol_);
  arr_fields = std::
               get<0ul,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>,std::unordered_map<Symbol,std::shared_ptr<Method>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::shared_ptr<Method>>>>,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>>
                         (pmVar3);
  pmVar3 = std::
           unordered_map<Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>_>_>_>
           ::operator[](&this->tree_->class_symbols_table_,&this->current_layer_->class_symbol_);
  local_28 = std::
             get<2ul,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>,std::unordered_map<Symbol,std::shared_ptr<Method>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::shared_ptr<Method>>>>,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>>
                       (pmVar3);
  p_Var1 = arr_fields;
  std::__cxx11::string::string((string *)&local_70,(string *)&(fields->_M_h)._M_bucket_count);
  Symbol::Symbol(&local_50,&local_70);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>
       ::find(p_Var1,&local_50);
  local_88[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>
       ::end(arr_fields);
  bVar2 = std::__detail::operator!=(&local_30,local_88);
  Symbol::~Symbol(&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  this_00 = arr_fields;
  p_Var1 = local_28;
  if (bVar2) {
    std::__cxx11::string::string((string *)&local_c8,(string *)&(fields->_M_h)._M_bucket_count);
    Symbol::Symbol(&local_a8,&local_c8);
    pmVar4 = std::
             unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>
             ::operator[](this_00,&local_a8);
    pmVar5 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->type_system_,&pmVar4->first);
    (this->super_TemplateVisitor<int>).tos_value_ = *pmVar5;
    Symbol::~Symbol(&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  else {
    std::__cxx11::string::string((string *)&local_108,(string *)&(fields->_M_h)._M_bucket_count);
    Symbol::Symbol(&local_e8,&local_108);
    pmVar4 = std::
             unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>
             ::operator[](p_Var1,&local_e8);
    pmVar5 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->type_system_,&pmVar4->first);
    (this->super_TemplateVisitor<int>).tos_value_ = *pmVar5;
    Symbol::~Symbol(&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
  }
  return;
}

Assistant:

void TypeCheckingVisitor::Visit(FieldAccess* field_access) {
  auto& fields =
      std::get<0>(tree_->class_symbols_table_[current_layer_->class_symbol_]);
  auto& arr_fields =
      std::get<2>(tree_->class_symbols_table_[current_layer_->class_symbol_]);
  if (fields.find(Symbol(field_access->field_name_)) != fields.end()) {
    tos_value_ = type_system_[fields[Symbol(field_access->field_name_)].first];
  } else {
    tos_value_ =
        type_system_[arr_fields[Symbol(field_access->field_name_)].first];
  }
}